

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O2

void __thiscall ObjectFile::refresh(ObjectFile *this,bool isFirstTime)

{
  string *psVar1;
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  pointer pcVar2;
  bool bVar3;
  mapped_type *ppOVar4;
  OSAttribute *pOVar5;
  int iVar6;
  int in_EDX;
  char *format;
  unsigned_long p11AttrType;
  bool value;
  undefined7 uStack_d7;
  _Rb_tree_node_base local_d0;
  size_t local_b0;
  File objectFile;
  unsigned_long osAttrType;
  unsigned_long curGen;
  MutexLocker lock;
  string local_50;
  
  if (this->inTransaction == true) {
    format = "The object is in a transaction";
    iVar6 = 0x121;
LAB_00161764:
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,iVar6,format);
    return;
  }
  if (!isFirstTime) {
    if (this->token != (OSToken *)0x0) {
      OSToken::index(this->token,(char *)0x0,in_EDX);
    }
    if ((this->gen == (Generation *)0x0) || (bVar3 = Generation::wasUpdated(this->gen), !bVar3)) {
      format = "The object generation has not been updated";
      iVar6 = 0x130;
      goto LAB_00161764;
    }
  }
  psVar1 = &this->path;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar1);
  File::File(&objectFile,&local_50,this->umask,true,false,false,true);
  std::__cxx11::string::~string((string *)&local_50);
  bVar3 = File::isValid(&objectFile);
  if (!bVar3) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x139,"Object %s is invalid",(psVar1->_M_dataplus)._M_p);
    this->valid = false;
    goto LAB_00161c7b;
  }
  File::lock(&objectFile,true);
  bVar3 = File::isEmpty(&objectFile);
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  if (bVar3) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x144,"Object %s is empty",pcVar2);
    File::unlock(&objectFile);
    goto LAB_00161c7b;
  }
  softHSMLog(7,"refresh",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
             ,0x14b,"Object %s has changed",pcVar2);
  discardAttributes(this);
  MutexLocker::MutexLocker(&lock,this->objectMutex);
  bVar3 = File::readULong(&objectFile,&curGen);
  if (bVar3) {
    Generation::set(this->gen,curGen);
LAB_00161824:
    this_00 = &this->attributes;
LAB_00161832:
    do {
      bVar3 = File::isEOF(&objectFile);
      if (bVar3) {
LAB_00161c29:
        File::unlock(&objectFile);
        this->valid = true;
        break;
      }
      bVar3 = File::readULong(&objectFile,&p11AttrType);
      if (!bVar3) {
        bVar3 = File::isEOF(&objectFile);
        iVar6 = 0x174;
        if (bVar3) goto LAB_00161c29;
LAB_00161c3e:
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,iVar6,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
LAB_00161c60:
        this->valid = false;
        File::unlock(&objectFile);
        break;
      }
      bVar3 = File::readULong(&objectFile,&osAttrType);
      if (!bVar3) {
        iVar6 = 0x17f;
        goto LAB_00161c3e;
      }
      switch(osAttrType) {
      case 1:
        bVar3 = File::readBool(&objectFile,&value);
        if (bVar3) {
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          if (*ppOVar4 != (mapped_type)0x0) {
            ppOVar4 = std::
                      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                      ::operator[](this_00,&p11AttrType);
            if (*ppOVar4 != (mapped_type)0x0) {
              (*(*ppOVar4)->_vptr_OSAttribute[1])();
            }
          }
          pOVar5 = (OSAttribute *)operator_new(0xa0);
          OSAttribute::OSAttribute(pOVar5,value);
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          goto LAB_00161b02;
        }
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,399,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
        this->valid = false;
        File::unlock(&objectFile);
        goto LAB_00161c6e;
      case 2:
        bVar3 = File::readULong(&objectFile,(unsigned_long *)&value);
        if (!bVar3) {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1a5,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
          this->valid = false;
          File::unlock(&objectFile);
          goto LAB_00161c6e;
        }
        ppOVar4 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&p11AttrType);
        if (*ppOVar4 != (mapped_type)0x0) {
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          if (*ppOVar4 != (mapped_type)0x0) {
            (*(*ppOVar4)->_vptr_OSAttribute[1])();
          }
        }
        pOVar5 = (OSAttribute *)operator_new(0xa0);
        OSAttribute::OSAttribute(pOVar5,CONCAT71(uStack_d7,value));
        ppOVar4 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[](this_00,&p11AttrType);
LAB_00161b02:
        *ppOVar4 = pOVar5;
        goto LAB_00161832;
      case 3:
        ByteString::ByteString((ByteString *)&value);
        bVar3 = File::readByteString(&objectFile,(ByteString *)&value);
        if (bVar3) {
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          if (*ppOVar4 != (mapped_type)0x0) {
            ppOVar4 = std::
                      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                      ::operator[](this_00,&p11AttrType);
            if (*ppOVar4 != (mapped_type)0x0) {
              (*(*ppOVar4)->_vptr_OSAttribute[1])();
            }
          }
          pOVar5 = (OSAttribute *)operator_new(0xa0);
          OSAttribute::OSAttribute(pOVar5,(ByteString *)&value);
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          *ppOVar4 = pOVar5;
        }
        else {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1bb,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
          this->valid = false;
          File::unlock(&objectFile);
        }
        ByteString::~ByteString((ByteString *)&value);
        break;
      case 4:
        local_d0._M_color = _S_red;
        local_d0._M_parent = (_Base_ptr)0x0;
        local_d0._M_left = &local_d0;
        local_b0 = 0;
        local_d0._M_right = local_d0._M_left;
        bVar3 = File::readAttributeMap
                          (&objectFile,
                           (map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                            *)&value);
        if (bVar3) {
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          if (*ppOVar4 != (mapped_type)0x0) {
            ppOVar4 = std::
                      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                      ::operator[](this_00,&p11AttrType);
            if (*ppOVar4 != (mapped_type)0x0) {
              (*(*ppOVar4)->_vptr_OSAttribute[1])();
            }
          }
          pOVar5 = (OSAttribute *)operator_new(0xa0);
          OSAttribute::OSAttribute
                    (pOVar5,(map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                             *)&value);
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          *ppOVar4 = pOVar5;
        }
        else {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1e7,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
          this->valid = false;
          File::unlock(&objectFile);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                     *)&value);
        break;
      case 5:
        local_d0._M_color = _S_red;
        local_d0._M_parent = (_Base_ptr)0x0;
        local_d0._M_left = &local_d0;
        local_b0 = 0;
        local_d0._M_right = local_d0._M_left;
        bVar3 = File::readMechanismTypeSet
                          (&objectFile,
                           (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&value);
        if (bVar3) {
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          if (*ppOVar4 != (mapped_type)0x0) {
            ppOVar4 = std::
                      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                      ::operator[](this_00,&p11AttrType);
            if (*ppOVar4 != (mapped_type)0x0) {
              (*(*ppOVar4)->_vptr_OSAttribute[1])();
            }
          }
          pOVar5 = (OSAttribute *)operator_new(0xa0);
          OSAttribute::OSAttribute
                    (pOVar5,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&value);
          ppOVar4 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[](this_00,&p11AttrType);
          *ppOVar4 = pOVar5;
        }
        else {
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1d1,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
          this->valid = false;
          File::unlock(&objectFile);
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&value);
        break;
      default:
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x1f9,"Corrupt object file %s with unknown attribute of type %d",
                   (psVar1->_M_dataplus)._M_p,osAttrType);
        goto LAB_00161c60;
      }
    } while (bVar3 != false);
  }
  else {
    bVar3 = File::isEOF(&objectFile);
    if (bVar3) goto LAB_00161824;
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x159,"Corrupt object file %s",(psVar1->_M_dataplus)._M_p);
    this->valid = false;
    File::unlock(&objectFile);
  }
LAB_00161c6e:
  MutexLocker::~MutexLocker(&lock);
LAB_00161c7b:
  File::~File(&objectFile);
  return;
}

Assistant:

void ObjectFile::refresh(bool isFirstTime /* = false */)
{
	// Check if we're in the middle of a transaction
	if (inTransaction)
	{
		DEBUG_MSG("The object is in a transaction");

		return;
	}

	// Refresh the associated token if set
	if (!isFirstTime && (token != NULL))
	{
		// This may cause this instance to become invalid
		token->index();
	}

	// Check the generation
	if (!isFirstTime && (gen == NULL || !gen->wasUpdated()))
	{
		DEBUG_MSG("The object generation has not been updated");

		return;
	}

	File objectFile(path, umask);

	if (!objectFile.isValid())
	{
		DEBUG_MSG("Object %s is invalid", path.c_str());

		valid = false;

		return;
	}

	objectFile.lock();

	if (objectFile.isEmpty())
	{
		DEBUG_MSG("Object %s is empty", path.c_str());
		
		objectFile.unlock();

		return;
	}

	DEBUG_MSG("Object %s has changed", path.c_str());

	// Discard the existing set of attributes
	discardAttributes();

	MutexLocker lock(objectMutex);

	// Read back the generation number
	unsigned long curGen;

	if (!objectFile.readULong(curGen))
	{
		if (!objectFile.isEOF())
		{
			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}
	}
	else
	{
		gen->set(curGen);
	}

	// Read back the attributes
	while (!objectFile.isEOF())
	{
		unsigned long p11AttrType;
		unsigned long osAttrType;

		if (!objectFile.readULong(p11AttrType))
		{
			if (objectFile.isEOF())
			{
				break;
			}

			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}

		if (!objectFile.readULong(osAttrType))
		{
			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}

		// Depending on the type, read back the actual value
		if (osAttrType == BOOLEAN_ATTR)
		{
			bool value;

			if (!objectFile.readBool(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == ULONG_ATTR)
		{
			unsigned long value;

			if (!objectFile.readULong(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == BYTESTR_ATTR)
		{
			ByteString value;

			if (!objectFile.readByteString(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == MECHSET_ATTR)
		{
			std::set<CK_MECHANISM_TYPE> value;

			if (!objectFile.readMechanismTypeSet(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == ATTRMAP_ATTR)
		{
			std::map<CK_ATTRIBUTE_TYPE,OSAttribute> value;

			if (!objectFile.readAttributeMap(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else
		{
			DEBUG_MSG("Corrupt object file %s with unknown attribute of type %d", path.c_str(), osAttrType);

			valid = false;

			objectFile.unlock();

			return;
		}
	}

	objectFile.unlock();

	valid = true;
}